

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

void testutil_random_fe_non_zero(secp256k1_fe *nz)

{
  ushort uVar1;
  ushort uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int extraout_EDX;
  uint64_t *t;
  secp256k1_fe *psVar10;
  undefined8 in_RSI;
  secp256k1_fe *psVar11;
  secp256k1_fe *psVar12;
  secp256k1_fe *psVar13;
  secp256k1_fe *r;
  uint64_t uVar14;
  secp256k1_fe sStack_318;
  secp256k1_fe sStack_2e8;
  secp256k1_fe *psStack_2b8;
  secp256k1_fe sStack_290;
  secp256k1_fe sStack_260;
  uint64_t uStack_230;
  uint64_t uStack_228;
  uint64_t uStack_220;
  uint64_t uStack_218;
  secp256k1_fe *psStack_210;
  secp256k1_fe *psStack_208;
  code *pcStack_200;
  secp256k1_fe sStack_1f8;
  ushort auStack_1c8 [16];
  uint16_t auStack_1a8 [16];
  secp256k1_fe sStack_188;
  ushort auStack_148 [16];
  ushort auStack_128 [16];
  secp256k1_fe sStack_108;
  secp256k1_fe sStack_c8;
  secp256k1_fe sStack_98;
  secp256k1_fe *psStack_68;
  ulong uStack_60;
  code *pcStack_58;
  secp256k1_fe sStack_50;
  secp256k1_fe *psStack_20;
  
  while( true ) {
    testutil_random_fe(nz);
    psVar12 = nz;
    secp256k1_fe_verify(nz);
    iVar6 = (int)in_RSI;
    if (nz->normalized == 0) break;
    if (((nz->n[3] != 0 || nz->n[1] != 0) || (nz->n[2] != 0 || nz->n[0] != 0)) || nz->n[4] != 0) {
      return;
    }
  }
  testutil_random_fe_non_zero_cold_1();
  psVar13 = &sStack_50;
  pcStack_58 = (code *)0x14b7a4;
  psStack_20 = nz;
  uVar5 = testrand_int(iVar6 + 1);
  pcStack_58 = (code *)0x14b7af;
  secp256k1_fe_normalize(psVar12);
  if (uVar5 == 0) {
    return;
  }
  sStack_50.magnitude = 0;
  sStack_50.normalized = 1;
  sStack_50.n[0] = 0;
  sStack_50.n[1] = 0;
  sStack_50.n[2] = 0;
  sStack_50.n[3] = 0;
  sStack_50.n[4] = 0;
  pcStack_58 = (code *)0x14b7e5;
  secp256k1_fe_verify(&sStack_50);
  pcStack_58 = (code *)0x14b7ed;
  secp256k1_fe_verify(&sStack_50);
  pcStack_58 = (code *)0x14b7f7;
  secp256k1_fe_verify_magnitude(&sStack_50,0);
  sStack_50.n[0] = 0x1ffffdfffff85e;
  sStack_50.n[1] = 0x1ffffffffffffe;
  sStack_50.n[2] = 0x1ffffffffffffe;
  sStack_50.n[3] = 0x1ffffffffffffe;
  sStack_50.n[4] = 0x1fffffffffffe;
  sStack_50.magnitude = 1;
  sStack_50.normalized = 0;
  pcStack_58 = (code *)0x14b838;
  secp256k1_fe_verify(&sStack_50);
  psVar11 = (secp256k1_fe *)(ulong)(uVar5 - 1);
  pcStack_58 = (code *)0x14b844;
  secp256k1_fe_mul_int_unchecked(&sStack_50,uVar5 - 1);
  pcStack_58 = (code *)0x14b84c;
  secp256k1_fe_verify(psVar12);
  pcStack_58 = (code *)0x14b854;
  secp256k1_fe_verify(&sStack_50);
  iVar6 = sStack_50.magnitude + psVar12->magnitude;
  if (iVar6 < 0x21) {
    uVar14 = psVar12->n[1];
    uVar3 = psVar12->n[2];
    uVar4 = psVar12->n[3];
    psVar12->n[0] = psVar12->n[0] + sStack_50.n[0];
    psVar12->n[1] = uVar14 + sStack_50.n[1];
    psVar12->n[2] = uVar3 + sStack_50.n[2];
    psVar12->n[3] = uVar4 + sStack_50.n[3];
    psVar12->n[4] = psVar12->n[4] + sStack_50.n[4];
    psVar12->magnitude = iVar6;
    psVar12->normalized = 0;
    pcStack_58 = (code *)0x14b898;
    psVar13 = psVar12;
    secp256k1_fe_verify(psVar12);
    if (psVar12->magnitude == uVar5) {
      return;
    }
  }
  else {
    pcStack_58 = (code *)0x14b8ad;
    testutil_random_fe_magnitude_cold_2();
  }
  pcStack_58 = test_fe_mul;
  testutil_random_fe_magnitude_cold_1();
  pcStack_58 = (code *)&sStack_50;
  uStack_60 = (ulong)uVar5;
  psStack_68 = psVar12;
  sStack_1f8.n[0] = psVar13->n[0];
  sStack_1f8.n[1] = psVar13->n[1];
  sStack_1f8.n[2] = psVar13->n[2];
  sStack_1f8.n[3] = psVar13->n[3];
  sStack_1f8.n[4] = psVar13->n[4];
  sStack_1f8.magnitude = psVar13->magnitude;
  sStack_1f8.normalized = psVar13->normalized;
  if (extraout_EDX == 0) {
    pcStack_200 = (code *)0x14b8f6;
    secp256k1_fe_mul(&sStack_1f8,&sStack_1f8,psVar11);
  }
  else {
    pcStack_200 = (code *)0x14b8ec;
    secp256k1_fe_sqr(&sStack_1f8,&sStack_1f8);
  }
  sStack_98.n[0] = psVar13->n[0];
  sStack_98.n[1] = psVar13->n[1];
  sStack_98.n[2] = psVar13->n[2];
  sStack_98.n[3] = psVar13->n[3];
  sStack_98.n[4] = psVar13->n[4];
  sStack_98.magnitude = psVar13->magnitude;
  sStack_98.normalized = psVar13->normalized;
  sStack_c8.n[0] = psVar11->n[0];
  sStack_c8.n[1] = psVar11->n[1];
  sStack_c8.n[2] = psVar11->n[2];
  sStack_c8.n[3] = psVar11->n[3];
  sStack_c8.n[4] = psVar11->n[4];
  sStack_c8.magnitude = psVar11->magnitude;
  sStack_c8.normalized = psVar11->normalized;
  pcStack_200 = (code *)0x14b943;
  secp256k1_fe_normalize_var(&sStack_1f8);
  pcStack_200 = (code *)0x14b94b;
  secp256k1_fe_normalize_var(&sStack_98);
  pcStack_200 = (code *)0x14b953;
  secp256k1_fe_normalize_var(&sStack_c8);
  pcStack_200 = (code *)0x14b963;
  secp256k1_fe_get_b32((uchar *)auStack_128,&sStack_98);
  pcStack_200 = (code *)0x14b973;
  secp256k1_fe_get_b32((uchar *)auStack_148,&sStack_c8);
  pcStack_200 = (code *)0x14b983;
  secp256k1_fe_get_b32((uchar *)(sStack_188.n + 4),&sStack_1f8);
  lVar8 = 0x10;
  lVar9 = 0;
  do {
    uVar1 = auStack_148[lVar8 + -1];
    *(ushort *)((long)sStack_188.n + lVar9) =
         auStack_128[lVar8 + -1] << 8 | auStack_128[lVar8 + -1] >> 8;
    uVar2 = *(ushort *)((long)sStack_188.n + lVar8 * 2 + 0x1e);
    *(ushort *)((long)auStack_1a8 + lVar9) = uVar1 << 8 | uVar1 >> 8;
    *(ushort *)((long)auStack_1c8 + lVar9) = uVar2 << 8 | uVar2 >> 8;
    lVar9 = lVar9 + 2;
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  psVar13 = &sStack_108;
  psVar12 = &sStack_188;
  pcStack_200 = (code *)0x14b9e4;
  mulmod256((uint16_t *)psVar13,(uint16_t *)psVar12,auStack_1a8,test_fe_mul::m16);
  lVar8 = 0;
  while (*(char *)((long)sStack_108.n + lVar8) == *(char *)((long)auStack_1c8 + lVar8)) {
    lVar8 = lVar8 + 1;
    if (lVar8 == 0x20) {
      return;
    }
  }
  pcStack_200 = test_sqrt;
  test_fe_mul_cold_1();
  r = &sStack_290;
  psVar10 = &sStack_290;
  psVar11 = &sStack_260;
  psStack_210 = &sStack_c8;
  psStack_208 = &sStack_98;
  pcStack_200 = (code *)&sStack_1f8;
  uVar7 = secp256k1_fe_sqrt(psVar11,psVar13);
  if (uVar7 == (psVar12 == (secp256k1_fe *)0x0)) {
    test_sqrt_cold_6();
LAB_0014bbeb:
    test_sqrt_cold_5();
LAB_0014bbf0:
    test_sqrt_cold_4();
LAB_0014bbf5:
    r = psVar11;
    psVar10 = psVar12;
    test_sqrt_cold_3();
  }
  else {
    if (psVar12 == (secp256k1_fe *)0x0) {
      return;
    }
    secp256k1_fe_verify(&sStack_260);
    psVar13 = (secp256k1_fe *)0x1;
    secp256k1_fe_verify_magnitude(&sStack_260,1);
    sStack_290.n[0] = 0x3ffffbfffff0bc - sStack_260.n[0];
    sStack_290.n[1] = 0x3ffffffffffffc - sStack_260.n[1];
    sStack_290.n[2] = 0x3ffffffffffffc - sStack_260.n[2];
    sStack_290.n[3] = 0x3ffffffffffffc - sStack_260.n[3];
    uVar14 = 0x3fffffffffffc - sStack_260.n[4];
    sStack_290.magnitude = 2;
    sStack_290.normalized = 0;
    sStack_290.n[4] = uVar14;
    uStack_230 = sStack_290.n[2];
    uStack_228 = sStack_290.n[3];
    uStack_220 = sStack_290.n[0];
    uStack_218 = sStack_290.n[1];
    secp256k1_fe_verify(&sStack_290);
    secp256k1_fe_verify(&sStack_260);
    psVar11 = psVar12;
    secp256k1_fe_verify(psVar12);
    iVar6 = psVar12->magnitude + sStack_260.magnitude;
    if (0x20 < iVar6) goto LAB_0014bbeb;
    sStack_260.n[0] = psVar12->n[0] + sStack_260.n[0];
    sStack_260.n[1] = psVar12->n[1] + sStack_260.n[1];
    sStack_260.n[2] = psVar12->n[2] + sStack_260.n[2];
    sStack_260.n[3] = psVar12->n[3] + sStack_260.n[3];
    sStack_260.n[4] = sStack_260.n[4] + psVar12->n[4];
    sStack_260.normalized = 0;
    sStack_260.magnitude = iVar6;
    secp256k1_fe_verify(&sStack_260);
    secp256k1_fe_verify(&sStack_290);
    psVar11 = psVar12;
    secp256k1_fe_verify(psVar12);
    if (0x1e < psVar12->magnitude) goto LAB_0014bbf0;
    sStack_290.n[0] = psVar12->n[0] + uStack_220;
    sStack_290.n[1] = psVar12->n[1] + uStack_218;
    sStack_290.n[2] = psVar12->n[2] + uStack_230;
    sStack_290.n[3] = psVar12->n[3] + uStack_228;
    sStack_290.n[4] = uVar14 + psVar12->n[4];
    sStack_290.normalized = 0;
    sStack_290.magnitude = psVar12->magnitude + 2;
    secp256k1_fe_verify(&sStack_290);
    secp256k1_fe_normalize(&sStack_260);
    secp256k1_fe_normalize(&sStack_290);
    psVar11 = &sStack_260;
    secp256k1_fe_verify(&sStack_260);
    psVar12 = &sStack_260;
    if (sStack_260.normalized == 0) goto LAB_0014bbf5;
    if (((sStack_260.n[1] == 0 && sStack_260.n[3] == 0) &&
        (sStack_260.n[0] == 0 && sStack_260.n[2] == 0)) && sStack_260.n[4] == 0) {
      return;
    }
    secp256k1_fe_verify(&sStack_290);
    if (sStack_290.normalized != 0) {
      psVar10 = &sStack_290;
      if (((sStack_290.n[1] == 0 && sStack_290.n[3] == 0) &&
          (sStack_290.n[0] == 0 && sStack_290.n[2] == 0)) && sStack_290.n[4] == 0) {
        return;
      }
      goto LAB_0014bbff;
    }
  }
  test_sqrt_cold_2();
LAB_0014bbff:
  test_sqrt_cold_1();
  psVar12 = r + 2;
  psStack_2b8 = psVar10;
  testutil_random_fe_non_zero_test(psVar12);
  secp256k1_fe_sqr(&sStack_2e8,psVar12);
  secp256k1_fe_mul(&sStack_318,&sStack_2e8,psVar12);
  secp256k1_fe_mul(r,psVar13,&sStack_2e8);
  secp256k1_fe_mul(r + 1,psVar13 + 1,&sStack_318);
  *(int *)r[3].n = (int)psVar13[2].n[0];
  return;
}

Assistant:

static void testutil_random_fe_non_zero(secp256k1_fe *nz) {
    do {
        testutil_random_fe(nz);
    } while (secp256k1_fe_is_zero(nz));
}